

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

RowSetEntry * rowSetListToTree(RowSetEntry *pList)

{
  RowSetEntry *pRVar1;
  int iDepth;
  RowSetEntry *in_RDI;
  long in_FS_OFFSET;
  RowSetEntry *local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_28 = in_RDI->pRight;
  in_RDI->pRight = (RowSetEntry *)0x0;
  in_RDI->pLeft = (RowSetEntry *)0x0;
  if (local_28 == (RowSetEntry *)0x0) {
    local_28 = (RowSetEntry *)0x0;
  }
  else {
    iDepth = 1;
    pRVar1 = in_RDI;
    do {
      in_RDI = local_28;
      local_28 = in_RDI->pRight;
      in_RDI->pLeft = pRVar1;
      pRVar1 = rowSetNDeepTree(&local_28,iDepth);
      in_RDI->pRight = pRVar1;
      iDepth = iDepth + 1;
      pRVar1 = in_RDI;
    } while (local_28 != (RowSetEntry *)0x0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_20) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

static struct RowSetEntry *rowSetListToTree(struct RowSetEntry *pList){
  int iDepth;           /* Depth of the tree so far */
  struct RowSetEntry *p;       /* Current tree root */
  struct RowSetEntry *pLeft;   /* Left subtree */

  assert( pList!=0 );
  p = pList;
  pList = p->pRight;
  p->pLeft = p->pRight = 0;
  for(iDepth=1; pList; iDepth++){
    pLeft = p;
    p = pList;
    pList = p->pRight;
    p->pLeft = pLeft;
    p->pRight = rowSetNDeepTree(&pList, iDepth);
  }
  return p;
}